

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O3

section * __thiscall ELFIO::elfio::Sections::add(Sections *this,string *name)

{
  pointer pcVar1;
  uint uVar2;
  Elf_Word EVar3;
  section *psVar4;
  elfio *peVar5;
  ulong uVar6;
  string_section_accessor str_writer;
  string_section_accessor_template<ELFIO::section> local_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  psVar4 = create_section(this->parent);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + name->_M_string_length);
  (*psVar4->_vptr_section[4])(psVar4,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  peVar5 = this->parent;
  if (peVar5->header == (elf_header *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar2 = (*peVar5->header->_vptr_elf_header[0x20])();
    uVar6 = (ulong)(uVar2 & 0xffff);
    peVar5 = this->parent;
  }
  local_50.string_section =
       (peVar5->sections_).super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>.
       _M_impl.super__Vector_impl_data._M_start[uVar6];
  EVar3 = string_section_accessor_template<ELFIO::section>::add_string
                    (&local_50,(name->_M_dataplus)._M_p);
  (*psVar4->_vptr_section[0x16])(psVar4,(ulong)EVar3);
  return psVar4;
}

Assistant:

section* add( const std::string& name )
        {
            section* new_section = parent->create_section();
            new_section->set_name( name );

            Elf_Half str_index = parent->get_section_name_str_index();
            section* string_table( parent->sections_[str_index] );
            string_section_accessor str_writer( string_table );
            Elf_Word pos = str_writer.add_string( name );
            new_section->set_name_string_offset( pos );

            return new_section;
        }